

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O2

int secp256k1_ecdsa_sign
              (secp256k1_context *ctx,secp256k1_ecdsa_signature *signature,uchar *msg32,
              uchar *seckey,secp256k1_nonce_function noncefp,void *noncedata)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  code *pcVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint64_t uVar13;
  uint uVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  int local_23c;
  secp256k1_scalar s;
  secp256k1_scalar r;
  secp256k1_scalar local_1c8;
  uchar local_1a8 [32];
  secp256k1_scalar local_188;
  secp256k1_scalar local_168;
  uchar b [32];
  secp256k1_scalar local_128;
  secp256k1_ge r_1;
  secp256k1_gej rp;
  
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    (*(ctx->illegal_callback).fn)
              ("secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)",
               (ctx->illegal_callback).data);
    uVar12 = 0;
  }
  else {
    r.d[0] = 0;
    r.d[1] = 0;
    r.d[2] = 0;
    r.d[3] = 0;
    s.d[0] = 0;
    s.d[1] = 0;
    s.d[2] = 0;
    s.d[3] = 0;
    pcVar6 = nonce_function_rfc6979;
    if (noncefp != (secp256k1_nonce_function)0x0) {
      pcVar6 = noncefp;
    }
    uVar4 = secp256k1_scalar_set_b32_seckey(&local_168,seckey);
    secp256k1_scalar_cmov(&local_168,&secp256k1_scalar_one,uVar4 ^ 1);
    secp256k1_scalar_set_b32(&local_188,msg32,(int *)0x0);
    uVar14 = 0;
    while( true ) {
      uVar12 = 0;
      iVar5 = (*pcVar6)(local_1a8,msg32,seckey,(uchar *)0x0,noncedata,uVar14);
      if (iVar5 == 0) break;
      iVar5 = secp256k1_scalar_set_b32_seckey(&local_1c8,local_1a8);
      if (iVar5 != 0) {
        local_23c = 0;
        secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&rp,&local_1c8);
        secp256k1_ge_set_gej(&r_1,&rp);
        secp256k1_fe_normalize(&r_1.x);
        secp256k1_fe_normalize(&r_1.y);
        secp256k1_fe_get_b32(b,&r_1.x);
        uVar13 = 0;
        secp256k1_scalar_set_b32(&r,b,&local_23c);
        secp256k1_scalar_mul(&local_128,&r,&local_168);
        secp256k1_scalar_add(&local_128,&local_128,&local_188);
        secp256k1_scalar_inverse(&s,&local_1c8);
        secp256k1_scalar_mul(&s,&s,&local_128);
        secp256k1_gej_clear(&rp);
        secp256k1_ge_clear(&r_1);
        iVar5 = secp256k1_scalar_is_high(&s);
        bVar15 = iVar5 != 0;
        uVar9 = 0;
        if (bVar15) {
          uVar9 = 0xbfd25e8cd0364142;
        }
        uVar10 = 0;
        if (bVar15) {
          uVar10 = 0xbaaedce6af48a03b;
        }
        uVar11 = 0;
        if (bVar15) {
          uVar11 = 0xfffffffffffffffe;
        }
        uVar8 = -(ulong)bVar15;
        uVar1 = (ulong)CARRY8(s.d[0] ^ uVar8,uVar9);
        uVar2 = (s.d[1] ^ uVar8) + uVar10;
        uVar10 = (ulong)(CARRY8(s.d[1] ^ uVar8,uVar10) || CARRY8(uVar2,uVar1));
        uVar3 = (s.d[2] ^ uVar8) + uVar11;
        uVar7 = s.d[1] | s.d[0] | s.d[2] | s.d[3];
        s.d[3] = ((uVar8 ^ s.d[3]) - (ulong)bVar15) +
                 (ulong)(CARRY8(s.d[2] ^ uVar8,uVar11) || CARRY8(uVar3,uVar10));
        s.d[2] = uVar3 + uVar10;
        s.d[0] = (s.d[0] ^ uVar8) + uVar9;
        s.d[1] = uVar2 + uVar1;
        if (uVar7 == 0) {
          s.d[3] = uVar13;
          s.d[2] = uVar13;
          s.d[0] = uVar13;
          s.d[1] = uVar13;
        }
        auVar16._0_4_ = -(uint)((int)r.d[0] == 0 && (int)r.d[2] == 0);
        auVar16._4_4_ = -(uint)(r.d[0]._4_4_ == 0 && r.d[2]._4_4_ == 0);
        auVar16._8_4_ = -(uint)((int)r.d[1] == 0 && (int)r.d[3] == 0);
        auVar16._12_4_ = -(uint)(r.d[1]._4_4_ == 0 && r.d[3]._4_4_ == 0);
        iVar5 = movmskps((int)uVar7,auVar16);
        if ((iVar5 != 0xf) && (((s.d[1] != 0 || s.d[0] != 0) || s.d[2] != 0) || s.d[3] != 0)) {
          uVar12 = 1;
          break;
        }
      }
      uVar14 = uVar14 + 1;
    }
    uVar12 = uVar12 & uVar4;
    secp256k1_scalar_cmov(&r,&secp256k1_scalar_zero,uVar12 ^ 1);
    secp256k1_scalar_cmov(&s,&secp256k1_scalar_zero,uVar12 ^ 1);
    *(uint64_t *)(signature->data + 0x10) = r.d[2];
    *(uint64_t *)(signature->data + 0x18) = r.d[3];
    *(uint64_t *)signature->data = r.d[0];
    *(uint64_t *)(signature->data + 8) = r.d[1];
    *(uint64_t *)(signature->data + 0x20) = s.d[0];
    *(uint64_t *)(signature->data + 0x28) = s.d[1];
    *(uint64_t *)(signature->data + 0x30) = s.d[2];
    *(uint64_t *)(signature->data + 0x38) = s.d[3];
  }
  return uVar12;
}

Assistant:

int secp256k1_ecdsa_sign(const secp256k1_context* ctx, secp256k1_ecdsa_signature *signature, const unsigned char *msg32, const unsigned char *seckey, secp256k1_nonce_function noncefp, const void* noncedata) {
    secp256k1_scalar r, s;
    int ret;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(msg32 != NULL);
    ARG_CHECK(signature != NULL);
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ecdsa_sign_inner(ctx, &r, &s, NULL, msg32, seckey, noncefp, noncedata);
    secp256k1_ecdsa_signature_save(signature, &r, &s);
    return ret;
}